

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

FileDescriptorProto *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::FileDescriptorProto>(Arena *arena)

{
  FileDescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (FileDescriptorProto *)operator_new(0xd8);
    FileDescriptorProto::FileDescriptorProto(this,(Arena *)0x0,false);
  }
  else {
    this = (FileDescriptorProto *)
           AllocateAlignedWithHook(arena,0xd8,(type_info *)&FileDescriptorProto::typeinfo);
    FileDescriptorProto::FileDescriptorProto(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }